

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_forward_Test::
~IntrusiveListIteratorTest_crbegin_crend_forward_Test
          (IntrusiveListIteratorTest_crbegin_crend_forward_Test *this)

{
  IntrusiveListIteratorTest_crbegin_crend_forward_Test *this_local;
  
  ~IntrusiveListIteratorTest_crbegin_crend_forward_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_forward) {
  TestForward(list_.crbegin(), list_.crend(), {3, 2, 1});
  TestForward(clist_.crbegin(), clist_.crend(), {3, 2, 1});
}